

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffgabc(int tfields,char **tform,int space,long *rowlen,long *tbcol,int *status)

{
  int iVar1;
  ulong uVar2;
  long width;
  int decims;
  int datacode;
  long local_40;
  int local_38;
  int local_34;
  
  iVar1 = *status;
  if (0 < iVar1) {
    return iVar1;
  }
  *rowlen = 0;
  if (0 < tfields) {
    *tbcol = 1;
    for (uVar2 = 0; (uint)tfields != uVar2; uVar2 = uVar2 + 1) {
      tbcol[uVar2] = *rowlen + 1;
      ffasfm(tform[uVar2],&local_34,&local_40,&local_38,status);
      *rowlen = *rowlen + local_40 + space;
    }
    *rowlen = *rowlen - (long)space;
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgabc(int tfields,     /* I - number of columns in the table           */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           int space,       /* I - number of spaces to leave between cols   */
           long *rowlen,    /* O - total width of a table row               */
           long *tbcol,     /* O - starting byte in row for each column     */
           int *status)     /* IO - error status                            */
/*
  calculate the starting byte offset of each column of an ASCII table
  and the total length of a row, in bytes.  The input space value determines
  how many blank spaces to leave between each column (1 is recommended).
*/
{
    int ii, datacode, decims;
    long width;

    if (*status > 0)
        return(*status);

    *rowlen=0;

    if (tfields <= 0)
        return(*status);

    tbcol[0] = 1;

    for (ii = 0; ii < tfields; ii++)
    {
        tbcol[ii] = *rowlen + 1;    /* starting byte in row of column */

        ffasfm(tform[ii], &datacode, &width, &decims, status);

        *rowlen += (width + space);  /* total length of row */
    }

    *rowlen -= space;  /*  don't add space after the last field */

    return (*status);
}